

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprintint.h
# Opt level: O0

int print_uint16(uint16_t n,char *p)

{
  uint uVar1;
  char *dp;
  char *pcStack_18;
  int k;
  char *p_local;
  uint16_t n_local;
  
  if (n < 1000) {
    if (n < 100) {
      if (n < 10) {
        dp._4_4_ = 1;
      }
      else {
        dp._4_4_ = 2;
      }
    }
    else {
      dp._4_4_ = 3;
    }
  }
  else if (n < 10000) {
    dp._4_4_ = 4;
  }
  else {
    dp._4_4_ = 5;
  }
  pcStack_18 = p + (int)dp._4_4_;
  *pcStack_18 = '\0';
  p_local._6_2_ = n;
  if ((dp._4_4_ & 1) == 0) {
    if (dp._4_4_ != 2) {
      if (dp._4_4_ != 4) {
        return dp._4_4_;
      }
      pcStack_18 = pcStack_18 + -2;
      p_local._6_2_ = n / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (int)((uint)n % 100 << 1));
    }
    *(undefined2 *)(pcStack_18 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (int)((uint)p_local._6_2_ % 100 << 1));
  }
  else {
    if (dp._4_4_ != 1) {
      if (dp._4_4_ != 3) {
        if (dp._4_4_ != 5) {
          return dp._4_4_;
        }
        pcStack_18 = pcStack_18 + -2;
        p_local._6_2_ = n / 100;
        *(undefined2 *)pcStack_18 =
             *(undefined2 *)
              (
              "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
              + (int)((uint)n % 100 << 1));
      }
      pcStack_18 = pcStack_18 + -2;
      uVar1 = (uint)p_local._6_2_;
      p_local._6_2_ = p_local._6_2_ / 100;
      *(undefined2 *)pcStack_18 =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (int)(uVar1 % 100 << 1));
    }
    pcStack_18[-1] = (char)p_local._6_2_ + '0';
  }
  return dp._4_4_;
}

Assistant:

static int print_uint16(uint16_t n, char *p)
{
    int k = 0;
    const char *dp;

    if (n >= 1000) {
        if(n >= 10000) {
            k = 5;
        } else {
            k = 4;
        }
    } else {
        if(n >= 100) {
            k = 3;
        } else if(n >= 10) {
            k = 2;
        } else {
            k = 1;
        }
    }
    p += k;
    *p = '\0';
    if (k & 1) {
        switch (k) {
        case 5:
            __print_stage();
	    pattribute(fallthrough);
        case 3:
            __print_stage();
	    pattribute(fallthrough);
        case 1:
            p[-1] = (char)n + '0';
        }
    } else {
        switch (k) {
        case 4:
            __print_stage();
	    pattribute(fallthrough);
        case 2:
            __print_stage();
        }
    }
    return k;
}